

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O1

char * soplex::getColName<double>(SPxLPBase<double> *lp,int idx,NameSet *cnames,char *buf)

{
  Item *pIVar1;
  DataKey local_30;
  SPxColId local_28;
  
  if (cnames != (NameSet *)0x0) {
    local_30 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[idx];
    SPxColId::SPxColId(&local_28,&local_30);
    pIVar1 = (cnames->set).theitem;
    if (-1 < pIVar1[local_28.super_DataKey.idx].info) {
      return cnames->mem + pIVar1[local_28.super_DataKey.idx].data;
    }
  }
  spxSnprintf(buf,0x10,"x%d",idx);
  return buf;
}

Assistant:

static const char* getColName(
   const SPxLPBase<R>*   lp,
   int            idx,
   const NameSet* cnames,
   char*          buf)
{
   assert(buf != nullptr);
   assert(idx >= 0);
   assert(idx < lp->nCols());

   if(cnames != nullptr)
   {
      DataKey key = lp->cId(idx);

      if(cnames->has(key))
         return (*cnames)[key];
   }

   spxSnprintf(buf, 16, "x%d", idx);

   return buf;
}